

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bnll.cpp
# Opt level: O0

int __thiscall ncnn::BNLL::forward_inplace(BNLL *this,Mat *bottom_top_blob,Option *opt)

{
  long *in_RSI;
  float fVar1;
  float fVar2;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  Mat *m;
  int local_158;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined4 local_130;
  long local_128;
  undefined4 local_120;
  undefined4 local_11c;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 local_110;
  undefined8 local_108;
  long local_100;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  long *local_d8;
  undefined1 local_c5;
  int local_c4;
  undefined8 *local_b8;
  undefined8 *local_b0;
  undefined8 *local_a0;
  long local_90;
  undefined4 local_84;
  long local_80;
  long local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  undefined4 local_54;
  long local_50;
  undefined8 *local_30;
  
  local_e4 = *(int *)((long)in_RSI + 0x2c);
  local_e8 = (int)in_RSI[6];
  local_ec = (int)in_RSI[7];
  local_f0 = local_e4 * local_e8;
  local_d8 = in_RSI;
  for (local_f4 = 0; local_f4 < local_ec; local_f4 = local_f4 + 1) {
    local_b8 = &local_148;
    local_64 = *(int *)((long)local_d8 + 0x2c);
    local_68 = (int)local_d8[6];
    local_6c = *(undefined4 *)((long)local_d8 + 0x34);
    local_100 = *local_d8 + local_d8[8] * (long)local_f4 * local_d8[2];
    local_80 = local_d8[2];
    local_84 = (undefined4)local_d8[3];
    local_90 = local_d8[4];
    local_60 = &local_148;
    local_50 = (long)local_64 * (long)local_68 * local_80;
    local_b0 = &local_148;
    local_a0 = &local_148;
    local_54 = 0x10;
    local_c4 = local_f4;
    local_c5 = 1;
    local_148 = 0;
    local_138 = 0;
    local_130 = 0;
    local_120 = 0;
    local_11c = 0;
    local_118 = 0;
    local_114 = 0;
    local_110 = 0;
    local_108 = 0;
    local_140 = 0;
    local_78 = local_100;
    local_30 = local_a0;
    local_128 = local_90;
    for (local_158 = 0; local_158 < local_f0; local_158 = local_158 + 1) {
      if (*(float *)(local_100 + (long)local_158 * 4) <= 0.0) {
        fVar2 = expf(*(float *)(local_100 + (long)local_158 * 4));
        fVar2 = logf(fVar2 + 1.0);
        *(float *)(local_100 + (long)local_158 * 4) = fVar2;
      }
      else {
        fVar2 = *(float *)(local_100 + (long)local_158 * 4);
        fVar1 = expf(-*(float *)(local_100 + (long)local_158 * 4));
        fVar1 = logf(fVar1 + 1.0);
        *(float *)(local_100 + (long)local_158 * 4) = fVar2 + fVar1;
      }
    }
  }
  return 0;
}

Assistant:

int BNLL::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            if (ptr[i] > 0)
                ptr[i] = ptr[i] + logf(1.f + expf(-ptr[i]));
            else
                ptr[i] = logf(1.f + expf(ptr[i]));
        }
    }

    return 0;
}